

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv1_cm_gears.c
# Opt level: O1

int create_gear(gears_t_conflict *gears,int id,float inner,float outer,float width,int teeth,
               float tooth_depth)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  gear_conflict *pgVar15;
  Vertex *pafVar16;
  Strip *pSVar17;
  long lVar18;
  float *pfVar19;
  long lVar20;
  char *pcVar21;
  float *__sinx;
  long lVar22;
  float fVar23;
  float fVar24;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  float s [5];
  float c [5];
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  long local_100;
  int local_f4;
  float local_f0;
  float local_ec;
  long local_e8;
  long local_e0;
  int local_d8;
  undefined4 uStack_d4;
  long local_d0;
  float local_c8;
  float local_c4;
  int local_c0;
  float local_bc;
  float local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  gears_t_conflict *local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  ulong local_80;
  Strip *local_78;
  long local_70;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [16];
  
  local_f0 = width;
  local_ec = inner;
  local_b8 = outer;
  uStack_b4 = in_XMM1_Db;
  uStack_b0 = in_XMM1_Dc;
  uStack_ac = in_XMM1_Dd;
  pgVar15 = (gear_conflict *)calloc(1,0x28);
  if (pgVar15 == (gear_conflict *)0x0) {
    puts("calloc gear failed");
    return -1;
  }
  gears->gear[(uint)id] = pgVar15;
  pgVar15->nvertices = 0;
  pafVar16 = (Vertex *)calloc((ulong)(uint)(teeth * 0x22),0x20);
  pgVar15->vertices = pafVar16;
  if (pafVar16 == (Vertex *)0x0) {
    pcVar21 = "calloc vertices failed";
  }
  else {
    pgVar15->nstrips = teeth * 7;
    pSVar17 = (Strip *)calloc((ulong)(uint)(teeth * 7),8);
    pgVar15->strips = pSVar17;
    if (pSVar17 != (Strip *)0x0) {
      local_f4 = id;
      local_a8 = gears;
      if (0 < teeth) {
        local_68 = local_b8 + -0.35;
        local_b8 = local_b8 + 0.35;
        local_c4 = 6.2831855 / (float)teeth;
        local_bc = local_c4 * 0.25;
        local_88 = (double)local_b8 * 0.36;
        local_90 = (double)local_68;
        local_c8 = local_f0 * 0.5;
        local_98 = local_90 * 0.36;
        local_a0 = (double)local_ec * 0.36;
        local_f0 = local_f0 * -0.5;
        local_48 = ZEXT416((uint)local_68);
        local_68 = -local_68;
        uStack_64 = 0x80000000;
        uStack_60 = 0x80000000;
        uStack_5c = 0x80000000;
        local_58 = -local_b8;
        uStack_54 = uStack_b4 ^ 0x80000000;
        uStack_50 = uStack_b0 ^ 0x80000000;
        uStack_4c = uStack_ac ^ 0x80000000;
        iVar13 = 0;
        lVar18 = 0;
        local_80 = (ulong)(uint)teeth;
        do {
          lVar22 = lVar18;
          local_100 = CONCAT44(local_100._4_4_,(float)iVar13 * local_c4);
          pfVar19 = &local_118;
          lVar18 = 0;
          __sinx = &local_138;
          local_c0 = iVar13;
          do {
            sincosf((float)(int)lVar18 * local_bc + (float)local_100,__sinx,pfVar19);
            lVar18 = lVar18 + 1;
            pfVar19 = pfVar19 + 1;
            __sinx = __sinx + 1;
          } while (lVar18 != 5);
          iVar13 = pgVar15->nvertices;
          lVar20 = (long)iVar13;
          pSVar17 = pgVar15->strips;
          pSVar17[lVar22].begin = iVar13;
          pafVar16 = pgVar15->vertices;
          lVar18 = lVar20 + 1;
          lVar1 = lVar20 + 2;
          lVar2 = lVar20 + 3;
          lVar3 = lVar20 + 4;
          lVar4 = lVar20 + 5;
          lVar5 = lVar20 + 6;
          lVar6 = lVar20 + 7;
          lVar7 = lVar20 + 8;
          lVar8 = lVar20 + 9;
          lVar9 = lVar20 + 10;
          lVar10 = lVar20 + 0xb;
          pafVar16[lVar20][0] = local_114 * local_b8;
          pafVar16[lVar20][1] = local_134 * local_b8;
          pafVar16[lVar20][2] = local_c8;
          *(float *)((long)(pafVar16 + lVar20) + 0xc) = 0.0;
          *(float *)((long)(pafVar16 + lVar20) + 0x10) = 0.0;
          pafVar16[lVar20][5] = 1.0;
          pafVar16[lVar20][6] = (float)(((double)local_134 * local_88) / local_90 + 0.5);
          pafVar16[lVar20][7] = (float)(((double)local_114 * local_88) / local_90 + 0.5);
          lVar11 = lVar20 + 0xc;
          pgVar15->nvertices = (int)lVar18;
          pafVar16[lVar18][0] = local_110 * local_b8;
          pafVar16[lVar18][1] = local_130 * local_b8;
          pafVar16[lVar18][2] = local_c8;
          *(float *)((long)(pafVar16 + lVar18) + 0xc) = 0.0;
          *(float *)((long)(pafVar16 + lVar18) + 0x10) = 0.0;
          pafVar16[lVar18][5] = 1.0;
          pafVar16[lVar18][6] = (float)(((double)local_130 * local_88) / local_90 + 0.5);
          pafVar16[lVar18][7] = (float)(((double)local_110 * local_88) / local_90 + 0.5);
          lVar18 = lVar20 + 0xd;
          pgVar15->nvertices = (int)lVar1;
          pafVar16[lVar1][0] = local_118 * (float)local_48._0_4_;
          pafVar16[lVar1][1] = local_138 * (float)local_48._0_4_;
          pafVar16[lVar1][2] = local_c8;
          *(float *)((long)(pafVar16 + lVar1) + 0xc) = 0.0;
          *(float *)((long)(pafVar16 + lVar1) + 0x10) = 0.0;
          pafVar16[lVar1][5] = 1.0;
          pafVar16[lVar1][6] = (float)(((double)local_138 * local_98) / local_90 + 0.5);
          pafVar16[lVar1][7] = (float)(((double)local_118 * local_98) / local_90 + 0.5);
          lVar1 = lVar20 + 0xe;
          pgVar15->nvertices = (int)lVar2;
          pafVar16[lVar2][0] = local_10c * (float)local_48._0_4_;
          pafVar16[lVar2][1] = local_12c * (float)local_48._0_4_;
          pafVar16[lVar2][2] = local_c8;
          *(float *)((long)(pafVar16 + lVar2) + 0xc) = 0.0;
          *(float *)((long)(pafVar16 + lVar2) + 0x10) = 0.0;
          pafVar16[lVar2][5] = 1.0;
          pafVar16[lVar2][6] = (float)(((double)local_12c * local_98) / local_90 + 0.5);
          pafVar16[lVar2][7] = (float)(((double)local_10c * local_98) / local_90 + 0.5);
          lVar2 = lVar20 + 0xf;
          pgVar15->nvertices = (int)lVar3;
          pafVar16[lVar3][0] = local_118 * local_ec;
          pafVar16[lVar3][1] = local_138 * local_ec;
          pafVar16[lVar3][2] = local_c8;
          *(float *)((long)(pafVar16 + lVar3) + 0xc) = 0.0;
          *(float *)((long)(pafVar16 + lVar3) + 0x10) = 0.0;
          pafVar16[lVar3][5] = 1.0;
          pafVar16[lVar3][6] = (float)(((double)local_138 * local_a0) / local_90 + 0.5);
          pafVar16[lVar3][7] = (float)(((double)local_118 * local_a0) / local_90 + 0.5);
          lVar3 = lVar20 + 0x10;
          pgVar15->nvertices = (int)lVar4;
          pafVar16[lVar4][0] = local_108 * (float)local_48._0_4_;
          pafVar16[lVar4][1] = local_128 * (float)local_48._0_4_;
          pafVar16[lVar4][2] = local_c8;
          *(float *)((long)(pafVar16 + lVar4) + 0xc) = 0.0;
          *(float *)((long)(pafVar16 + lVar4) + 0x10) = 0.0;
          pafVar16[lVar4][5] = 1.0;
          pafVar16[lVar4][6] = (float)(((double)local_128 * local_98) / local_90 + 0.5);
          pafVar16[lVar4][7] = (float)(((double)local_108 * local_98) / local_90 + 0.5);
          lVar4 = lVar20 + 0x11;
          pgVar15->nvertices = (int)lVar5;
          pafVar16[lVar5][0] = local_108 * local_ec;
          pafVar16[lVar5][1] = local_128 * local_ec;
          pafVar16[lVar5][2] = local_c8;
          *(float *)((long)(pafVar16 + lVar5) + 0xc) = 0.0;
          *(float *)((long)(pafVar16 + lVar5) + 0x10) = 0.0;
          pafVar16[lVar5][5] = 1.0;
          pafVar16[lVar5][6] = (float)(((double)local_128 * local_a0) / local_90 + 0.5);
          pafVar16[lVar5][7] = (float)(((double)local_108 * local_a0) / local_90 + 0.5);
          lVar5 = lVar20 + 0x12;
          pgVar15->nvertices = (int)lVar6;
          pSVar17[lVar22].count = 7;
          pSVar17[lVar22 + 1].begin = (int)lVar6;
          lVar12 = lVar20 + 0x13;
          pafVar16[lVar6][0] = local_114 * local_b8;
          pafVar16[lVar6][1] = local_134 * local_b8;
          pafVar16[lVar6][2] = local_f0;
          pfVar19 = pafVar16[lVar6] + 3;
          pfVar19[0] = 0.0;
          pfVar19[1] = 0.0;
          pfVar19[2] = -1.0;
          pfVar19[3] = 0.0;
          pafVar16[lVar6][7] = 0.0;
          lVar6 = lVar20 + 0x14;
          pgVar15->nvertices = (int)lVar7;
          pafVar16[lVar7][0] = local_110 * local_b8;
          pafVar16[lVar7][1] = local_130 * local_b8;
          pafVar16[lVar7][2] = local_f0;
          pfVar19 = pafVar16[lVar7] + 3;
          pfVar19[0] = 0.0;
          pfVar19[1] = 0.0;
          pfVar19[2] = -1.0;
          pfVar19[3] = 0.0;
          pafVar16[lVar7][7] = 0.0;
          local_70 = lVar20 + 0x15;
          pgVar15->nvertices = (int)lVar8;
          pafVar16[lVar8][0] = local_118 * (float)local_48._0_4_;
          pafVar16[lVar8][1] = local_138 * (float)local_48._0_4_;
          pafVar16[lVar8][2] = local_f0;
          pfVar19 = pafVar16[lVar8] + 3;
          pfVar19[0] = 0.0;
          pfVar19[1] = 0.0;
          pfVar19[2] = -1.0;
          pfVar19[3] = 0.0;
          pafVar16[lVar8][7] = 0.0;
          local_d0 = lVar20 + 0x16;
          pgVar15->nvertices = (int)lVar9;
          pafVar16[lVar9][0] = local_10c * (float)local_48._0_4_;
          pafVar16[lVar9][1] = local_12c * (float)local_48._0_4_;
          pafVar16[lVar9][2] = local_f0;
          pfVar19 = pafVar16[lVar9] + 3;
          pfVar19[0] = 0.0;
          pfVar19[1] = 0.0;
          pfVar19[2] = -1.0;
          pfVar19[3] = 0.0;
          pafVar16[lVar9][7] = 0.0;
          local_e8 = lVar20 + 0x17;
          pgVar15->nvertices = (int)lVar10;
          pafVar16 = pgVar15->vertices;
          pafVar16[lVar10][0] = local_118 * local_ec;
          pafVar16[lVar10][1] = local_138 * local_ec;
          pafVar16[lVar10][2] = local_f0;
          pfVar19 = pafVar16[lVar10] + 3;
          pfVar19[0] = 0.0;
          pfVar19[1] = 0.0;
          pfVar19[2] = -1.0;
          pfVar19[3] = 0.0;
          pafVar16[lVar10][7] = 0.0;
          local_e0 = lVar20 + 0x18;
          pgVar15->nvertices = (int)lVar11;
          pafVar16[lVar11][0] = local_108 * (float)local_48._0_4_;
          pafVar16[lVar11][1] = local_128 * (float)local_48._0_4_;
          pafVar16[lVar11][2] = local_f0;
          pfVar19 = pafVar16[lVar11] + 3;
          pfVar19[0] = 0.0;
          pfVar19[1] = 0.0;
          pfVar19[2] = -1.0;
          pfVar19[3] = 0.0;
          pafVar16[lVar11][7] = 0.0;
          lVar7 = lVar20 + 0x19;
          pgVar15->nvertices = (int)lVar18;
          pafVar16[lVar18][0] = local_108 * local_ec;
          pafVar16[lVar18][1] = local_128 * local_ec;
          pafVar16[lVar18][2] = local_f0;
          pfVar19 = pafVar16[lVar18] + 3;
          pfVar19[0] = 0.0;
          pfVar19[1] = 0.0;
          pfVar19[2] = -1.0;
          pfVar19[3] = 0.0;
          pafVar16[lVar18][7] = 0.0;
          pgVar15->nvertices = (int)lVar1;
          local_78 = pgVar15->strips;
          local_78[lVar22 + 1].count = 7;
          local_78[lVar22 + 2].begin = (int)lVar1;
          fVar23 = local_134 * local_b8 + local_138 * local_68;
          fVar24 = local_114 * local_58 + local_118 * (float)local_48._0_4_;
          pafVar16[lVar1][0] = local_118 * (float)local_48._0_4_;
          pafVar16[lVar1][1] = local_138 * (float)local_48._0_4_;
          pafVar16[lVar1][2] = local_c8;
          pafVar16[lVar1][3] = fVar23;
          pafVar16[lVar1][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar1) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar1) + 0x18) = 0.0;
          pafVar16[lVar1][7] = 0.0;
          lVar18 = lVar20 + 0x1a;
          pgVar15->nvertices = (int)lVar2;
          pafVar16[lVar2][0] = local_118 * (float)local_48._0_4_;
          pafVar16[lVar2][1] = local_138 * (float)local_48._0_4_;
          pafVar16[lVar2][2] = local_f0;
          pafVar16[lVar2][3] = fVar23;
          pafVar16[lVar2][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar2) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar2) + 0x18) = 0.0;
          pafVar16[lVar2][7] = 0.0;
          lVar1 = lVar20 + 0x1b;
          pgVar15->nvertices = (int)lVar3;
          pafVar16[lVar3][0] = local_114 * local_b8;
          pafVar16[lVar3][1] = local_134 * local_b8;
          pafVar16[lVar3][2] = local_c8;
          pafVar16[lVar3][3] = fVar23;
          pafVar16[lVar3][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar3) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar3) + 0x18) = 0.0;
          pafVar16[lVar3][7] = 0.0;
          lVar2 = lVar20 + 0x1c;
          pgVar15->nvertices = (int)lVar4;
          pafVar16[lVar4][0] = local_114 * local_b8;
          pafVar16[lVar4][1] = local_134 * local_b8;
          pafVar16[lVar4][2] = local_f0;
          pafVar16[lVar4][3] = fVar23;
          pafVar16[lVar4][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar4) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar4) + 0x18) = 0.0;
          pafVar16[lVar4][7] = 0.0;
          lVar3 = lVar20 + 0x1d;
          pgVar15->nvertices = (int)lVar5;
          local_78[lVar22 + 2].count = 4;
          local_78[lVar22 + 3].begin = (int)lVar5;
          fVar23 = local_130 - local_134;
          fVar24 = local_114 - local_110;
          pafVar16[lVar5][0] = local_114 * local_b8;
          pafVar16[lVar5][1] = local_134 * local_b8;
          pafVar16[lVar5][2] = local_c8;
          pafVar16[lVar5][3] = fVar23;
          pafVar16[lVar5][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar5) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar5) + 0x18) = 0.0;
          pafVar16[lVar5][7] = 0.0;
          lVar4 = lVar20 + 0x1e;
          pgVar15->nvertices = (int)lVar12;
          pafVar16[lVar12][0] = local_114 * local_b8;
          pafVar16[lVar12][1] = local_134 * local_b8;
          pafVar16[lVar12][2] = local_f0;
          pafVar16[lVar12][3] = fVar23;
          pafVar16[lVar12][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar12) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar12) + 0x18) = 0.0;
          pafVar16[lVar12][7] = 0.0;
          lVar5 = lVar20 + 0x1f;
          pgVar15->nvertices = (int)lVar6;
          pafVar16[lVar6][0] = local_110 * local_b8;
          pafVar16[lVar6][1] = local_130 * local_b8;
          pafVar16[lVar6][2] = local_c8;
          pafVar16[lVar6][3] = fVar23;
          pafVar16[lVar6][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar6) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar6) + 0x18) = 0.0;
          pafVar16[lVar6][7] = 0.0;
          lVar6 = lVar20 + 0x20;
          pgVar15->nvertices = (int)local_70;
          pafVar16[local_70][0] = local_110 * local_b8;
          pafVar16[local_70][1] = local_130 * local_b8;
          pafVar16[local_70][2] = local_f0;
          pafVar16[local_70][3] = fVar23;
          pafVar16[local_70][4] = fVar24;
          pafVar16[local_70][5] = 0.0;
          pafVar16 = pgVar15->vertices;
          *(float *)((long)(pafVar16 + local_70) + 0x18) = 0.0;
          *(float *)((long)(pafVar16 + local_70) + 0x1c) = 0.0;
          _local_d8 = CONCAT44((int)((ulong)lVar11 >> 0x20),iVar13 + 0x22);
          pgVar15->nvertices = (int)local_d0;
          local_78[lVar22 + 3].count = 4;
          local_78[lVar22 + 4].begin = (int)local_d0;
          fVar23 = local_12c * (float)local_48._0_4_ + local_130 * local_58;
          fVar24 = local_10c * local_68 + local_110 * local_b8;
          pafVar16[local_d0][0] = local_110 * local_b8;
          pafVar16[local_d0][1] = local_130 * local_b8;
          pafVar16[local_d0][2] = local_c8;
          pafVar16[local_d0][3] = fVar23;
          pafVar16[local_d0][4] = fVar24;
          *(float *)((long)(pafVar16 + local_d0) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + local_d0) + 0x18) = 0.0;
          pafVar16[local_d0][7] = 0.0;
          pgVar15->nvertices = (int)local_e8;
          pafVar16[local_e8][0] = local_110 * local_b8;
          pafVar16[local_e8][1] = local_130 * local_b8;
          pafVar16[local_e8][2] = local_f0;
          pafVar16[local_e8][3] = fVar23;
          pafVar16[local_e8][4] = fVar24;
          *(float *)((long)(pafVar16 + local_e8) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + local_e8) + 0x18) = 0.0;
          pafVar16[local_e8][7] = 0.0;
          pgVar15->nvertices = (int)local_e0;
          pafVar16[local_e0][0] = local_10c * (float)local_48._0_4_;
          pafVar16[local_e0][1] = local_12c * (float)local_48._0_4_;
          pafVar16[local_e0][2] = local_c8;
          pafVar16[local_e0][3] = fVar23;
          pafVar16[local_e0][4] = fVar24;
          *(float *)((long)(pafVar16 + local_e0) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + local_e0) + 0x18) = 0.0;
          pafVar16[local_e0][7] = 0.0;
          pgVar15->nvertices = (int)lVar7;
          pafVar16[lVar7][0] = local_10c * (float)local_48._0_4_;
          pafVar16[lVar7][1] = local_12c * (float)local_48._0_4_;
          pafVar16[lVar7][2] = local_f0;
          pafVar16[lVar7][3] = fVar23;
          pafVar16[lVar7][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar7) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar7) + 0x18) = 0.0;
          pafVar16[lVar7][7] = 0.0;
          pgVar15->nvertices = (int)lVar18;
          pSVar17 = pgVar15->strips;
          pSVar17[lVar22 + 4].count = 4;
          pSVar17[lVar22 + 5].begin = (int)lVar18;
          fVar23 = local_128 - local_12c;
          fVar24 = local_10c - local_108;
          pafVar16[lVar18][0] = local_10c * (float)local_48._0_4_;
          pafVar16[lVar18][1] = local_12c * (float)local_48._0_4_;
          pafVar16[lVar18][2] = local_c8;
          pafVar16[lVar18][3] = fVar23;
          pafVar16[lVar18][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar18) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar18) + 0x18) = 0.0;
          pafVar16[lVar18][7] = 0.0;
          pgVar15->nvertices = (int)lVar1;
          pafVar16[lVar1][0] = local_10c * (float)local_48._0_4_;
          pafVar16[lVar1][1] = local_12c * (float)local_48._0_4_;
          pafVar16[lVar1][2] = local_f0;
          pafVar16[lVar1][3] = fVar23;
          pafVar16[lVar1][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar1) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar1) + 0x18) = 0.0;
          pafVar16[lVar1][7] = 0.0;
          pgVar15->nvertices = (int)lVar2;
          pafVar16[lVar2][0] = local_108 * (float)local_48._0_4_;
          pafVar16[lVar2][1] = local_128 * (float)local_48._0_4_;
          pafVar16[lVar2][2] = local_c8;
          pafVar16[lVar2][3] = fVar23;
          pafVar16[lVar2][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar2) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar2) + 0x18) = 0.0;
          pafVar16[lVar2][7] = 0.0;
          pgVar15->nvertices = (int)lVar3;
          pafVar16[lVar3][0] = local_108 * (float)local_48._0_4_;
          pafVar16[lVar3][1] = local_128 * (float)local_48._0_4_;
          pafVar16[lVar3][2] = local_f0;
          pafVar16[lVar3][3] = fVar23;
          pafVar16[lVar3][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar3) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar3) + 0x18) = 0.0;
          pafVar16[lVar3][7] = 0.0;
          pgVar15->nvertices = (int)lVar4;
          pSVar17[lVar22 + 5].count = 4;
          pSVar17[lVar22 + 6].begin = (int)lVar4;
          fVar23 = local_138 - local_128;
          fVar24 = local_108 - local_118;
          pafVar16[lVar4][0] = local_118 * local_ec;
          pafVar16[lVar4][1] = local_138 * local_ec;
          pafVar16[lVar4][2] = local_c8;
          pafVar16[lVar4][3] = fVar23;
          pafVar16[lVar4][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar4) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar4) + 0x18) = 0.0;
          pafVar16[lVar4][7] = 0.0;
          pgVar15->nvertices = (int)lVar5;
          pafVar16[lVar5][0] = local_118 * local_ec;
          pafVar16[lVar5][1] = local_138 * local_ec;
          pafVar16[lVar5][2] = local_f0;
          pafVar16[lVar5][3] = fVar23;
          pafVar16[lVar5][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar5) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar5) + 0x18) = 0.0;
          pafVar16[lVar5][7] = 0.0;
          pgVar15->nvertices = (int)lVar6;
          pafVar16[lVar6][0] = local_108 * local_ec;
          pafVar16[lVar6][1] = local_128 * local_ec;
          pafVar16 = pgVar15->vertices;
          pafVar16[lVar6][2] = local_c8;
          pafVar16[lVar6][3] = fVar23;
          pafVar16[lVar6][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar6) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar6) + 0x18) = 0.0;
          pafVar16[lVar6][7] = 0.0;
          lVar20 = lVar20 + 0x21;
          pgVar15->nvertices = (int)lVar20;
          pafVar16[lVar20][0] = local_108 * local_ec;
          pafVar16[lVar20][1] = local_128 * local_ec;
          pafVar16[lVar20][2] = local_f0;
          pafVar16[lVar20][3] = fVar23;
          pafVar16[lVar20][4] = fVar24;
          *(float *)((long)(pafVar16 + lVar20) + 0x14) = 0.0;
          *(float *)((long)(pafVar16 + lVar20) + 0x18) = 0.0;
          pafVar16[lVar20][7] = 0.0;
          pgVar15->nvertices = iVar13 + 0x22;
          pSVar17[lVar22 + 6].count = 4;
          iVar13 = local_c0 + 1;
          lVar18 = lVar22 + 7;
          local_100 = lVar22;
        } while (iVar13 != (int)local_80);
      }
      gears = local_a8;
      (*local_a8->glGenBuffers)(1,&pgVar15->vbo);
      if (pgVar15->vbo == 0) {
        puts("glGenBuffers failed");
        id = local_f4;
      }
      else {
        (*gears->glBindBuffer)(0x8892,pgVar15->vbo);
        uVar14 = (*gears->glGetError)();
        if (uVar14 == 0) {
          (*gears->glBufferData)(0x8892,(long)pgVar15->nvertices << 5,pgVar15->vertices,0x88e4);
          uVar14 = (*gears->glGetError)();
          if (uVar14 == 0) {
            return 0;
          }
          pcVar21 = "glBufferData failed: 0x%x\n";
        }
        else {
          pcVar21 = "glBindBuffer failed: 0x%x\n";
        }
        printf(pcVar21,(ulong)uVar14);
        id = local_f4;
      }
      goto LAB_0010a244;
    }
    pcVar21 = "calloc strips failed";
  }
  puts(pcVar21);
LAB_0010a244:
  delete_gear(gears,id);
  return -1;
}

Assistant:

static int create_gear(gears_t *gears, int id, float inner, float outer, float width, int teeth, float tooth_depth)
{
  struct gear *gear;
  float r0, r1, r2, da, a1, ai, s[5], c[5];
  int i, j;
  float n[3], t[2];
  int k = 0;
  GLenum err = GL_NO_ERROR;

  gear = calloc(1, sizeof(struct gear));
  if (!gear) {
    printf("calloc gear failed\n");
    return -1;
  }

  gears->gear[id] = gear;

  gear->nvertices = 0;
  gear->vertices = calloc(34 * teeth, sizeof(Vertex));
  if (!gear->vertices) {
    printf("calloc vertices failed\n");
    goto out;
  }

  gear->nstrips = 7 * teeth;
  gear->strips = calloc(gear->nstrips, sizeof(Strip));
  if (!gear->strips) {
    printf("calloc strips failed\n");
    goto out;
  }

  r0 = inner;
  r1 = outer - tooth_depth / 2;
  r2 = outer + tooth_depth / 2;
  a1 = 2 * M_PI / teeth;
  da = a1 / 4;

  #define normal(nx, ny, nz) \
    n[0] = nx; \
    n[1] = ny; \
    n[2] = nz;

  #define texcoord(tx, ty) \
    t[0] = tx; \
    t[1] = ty;

  #define vertex(x, y, z) \
    gear->vertices[gear->nvertices][0] = x; \
    gear->vertices[gear->nvertices][1] = y; \
    gear->vertices[gear->nvertices][2] = z; \
    gear->vertices[gear->nvertices][3] = n[0]; \
    gear->vertices[gear->nvertices][4] = n[1]; \
    gear->vertices[gear->nvertices][5] = n[2]; \
    gear->vertices[gear->nvertices][6] = t[0]; \
    gear->vertices[gear->nvertices][7] = t[1]; \
    gear->nvertices++;

  for (i = 0; i < teeth; i++) {
    ai = i * a1;
    for (j = 0; j < 5; j++) {
      sincosf(ai + j * da, &s[j], &c[j]);
    }

    /* front face begin */
    gear->strips[k].begin = gear->nvertices;
    /* front face normal */
    normal(0, 0, 1);
    /* front face vertices */
    texcoord(0.36 * r2 * s[1] / r1 + 0.5, 0.36 * r2 * c[1] / r1 + 0.5);
    vertex(r2 * c[1], r2 * s[1], width / 2);
    texcoord(0.36 * r2 * s[2] / r1 + 0.5, 0.36 * r2 * c[2] / r1 + 0.5);
    vertex(r2 * c[2], r2 * s[2], width / 2);
    texcoord(0.36 * r1 * s[0] / r1 + 0.5, 0.36 * r1 * c[0] / r1 + 0.5);
    vertex(r1 * c[0], r1 * s[0], width / 2);
    texcoord(0.36 * r1 * s[3] / r1 + 0.5, 0.36 * r1 * c[3] / r1 + 0.5);
    vertex(r1 * c[3], r1 * s[3], width / 2);
    texcoord(0.36 * r0 * s[0] / r1 + 0.5, 0.36 * r0 * c[0] / r1 + 0.5);
    vertex(r0 * c[0], r0 * s[0], width / 2);
    texcoord(0.36 * r1 * s[4] / r1 + 0.5, 0.36 * r1 * c[4] / r1 + 0.5);
    vertex(r1 * c[4], r1 * s[4], width / 2);
    texcoord(0.36 * r0 * s[4] / r1 + 0.5, 0.36 * r0 * c[4] / r1 + 0.5);
    vertex(r0 * c[4], r0 * s[4], width / 2);
    texcoord(0, 0);
    /* front face end */
    gear->strips[k].count = 7;
    k++;

    /* back face begin */
    gear->strips[k].begin = gear->nvertices;
    /* back face normal */
    normal(0, 0, -1);
    /* back face vertices */
    vertex(r2 * c[1], r2 * s[1], -width / 2);
    vertex(r2 * c[2], r2 * s[2], -width / 2);
    vertex(r1 * c[0], r1 * s[0], -width / 2);
    vertex(r1 * c[3], r1 * s[3], -width / 2);
    vertex(r0 * c[0], r0 * s[0], -width / 2);
    vertex(r1 * c[4], r1 * s[4], -width / 2);
    vertex(r0 * c[4], r0 * s[4], -width / 2);
    /* back face end */
    gear->strips[k].count = 7;
    k++;

    /* first outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* first outward face normal */
    normal(r2 * s[1] - r1 * s[0], r1 * c[0] - r2 * c[1], 0);
    /* first outward face vertices */
    vertex(r1 * c[0], r1 * s[0],  width / 2);
    vertex(r1 * c[0], r1 * s[0], -width / 2);
    vertex(r2 * c[1], r2 * s[1],  width / 2);
    vertex(r2 * c[1], r2 * s[1], -width / 2);
    /* first outward face end */
    gear->strips[k].count = 4;
    k++;

    /* second outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* second outward face normal */
    normal(s[2] - s[1], c[1] - c[2], 0);
    /* second outward face vertices */
    vertex(r2 * c[1], r2 * s[1],  width / 2);
    vertex(r2 * c[1], r2 * s[1], -width / 2);
    vertex(r2 * c[2], r2 * s[2],  width / 2);
    vertex(r2 * c[2], r2 * s[2], -width / 2);
    /* second outward face end */
    gear->strips[k].count = 4;
    k++;

    /* third outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* third outward face normal */
    normal(r1 * s[3] - r2 * s[2], r2 * c[2] - r1 * c[3], 0);
    /* third outward face vertices */
    vertex(r2 * c[2], r2 * s[2],  width / 2);
    vertex(r2 * c[2], r2 * s[2], -width / 2);
    vertex(r1 * c[3], r1 * s[3],  width / 2);
    vertex(r1 * c[3], r1 * s[3], -width / 2);
    /* third outward face end */
    gear->strips[k].count = 4;
    k++;

    /* fourth outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* fourth outward face normal */
    normal(s[4] - s[3], c[3] - c[4], 0);
    /* fourth outward face vertices */
    vertex(r1 * c[3], r1 * s[3],  width / 2);
    vertex(r1 * c[3], r1 * s[3], -width / 2);
    vertex(r1 * c[4], r1 * s[4],  width / 2);
    vertex(r1 * c[4], r1 * s[4], -width / 2);
    /* fourth outward face end */
    gear->strips[k].count = 4;
    k++;

    /* inside face begin */
    gear->strips[k].begin = gear->nvertices;
    /* inside face normal */
    normal(s[0] - s[4], c[4] - c[0], 0);
    /* inside face vertices */
    vertex(r0 * c[0], r0 * s[0],  width / 2);
    vertex(r0 * c[0], r0 * s[0], -width / 2);
    vertex(r0 * c[4], r0 * s[4],  width / 2);
    vertex(r0 * c[4], r0 * s[4], -width / 2);
    /* inside face end */
    gear->strips[k].count = 4;
    k++;
  }

  /* vertex buffer object */

  gears->glGenBuffers(1, &gear->vbo);
  if (!gear->vbo) {
    printf("glGenBuffers failed\n");
    goto out;
  }

  gears->glBindBuffer(GL_ARRAY_BUFFER, gear->vbo);
  err = gears->glGetError();
  if (err) {
    printf("glBindBuffer failed: 0x%x\n", (unsigned int)err);
    goto out;
  }

  gears->glBufferData(GL_ARRAY_BUFFER, gear->nvertices * sizeof(Vertex), gear->vertices, GL_STATIC_DRAW);
  err = gears->glGetError();
  if (err) {
    printf("glBufferData failed: 0x%x\n", (unsigned int)err);
    goto out;
  }

  return 0;

out:
  delete_gear(gears, id);
  return -1;
}